

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

void pythonWarning(void *user_data,char *msg,...)

{
  int iVar1;
  PyObject *op;
  long lVar2;
  char local_448 [8];
  char buf [1024];
  va_list args;
  PyObject *result;
  PyObject *handler;
  char *msg_local;
  void *user_data_local;
  
  iVar1 = PyObject_HasAttrString(user_data,"warning");
  if (iVar1 != 0) {
    buf[0x3fc] = '0';
    buf[0x3fd] = '\0';
    buf[0x3fe] = '\0';
    buf[0x3ff] = '\0';
    buf[0x3f8] = '\x10';
    buf[0x3f9] = '\0';
    buf[0x3fa] = '\0';
    buf[0x3fb] = '\0';
    vsnprintf(local_448,0x3ff,msg,buf + 0x3f8);
    buf[0x3f7] = '\0';
    op = (PyObject *)_PyObject_CallMethod_SizeT(user_data,"warning","s",local_448);
    lVar2 = PyErr_Occurred();
    if (lVar2 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(op);
  }
  return;
}

Assistant:

static void
pythonWarning(void *user_data, const char *msg, ...)
{
    PyObject *handler;
    PyObject *result;
    va_list args;
    char buf[1024];

#ifdef DEBUG_SAX
    printf("pythonWarning(%s) called\n", msg);
#endif
    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "warning")) {
        va_start(args, msg);
        vsnprintf(buf, 1023, msg, args);
        va_end(args);
        buf[1023] = 0;
        result =
            PyObject_CallMethod(handler, (char *) "warning", (char *) "s",
                                buf);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(result);
    }
}